

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctf.cpp
# Opt level: O3

int __thiscall
CGameControllerCTF::OnCharacterDeath
          (CGameControllerCTF *this,CCharacter *pVictim,CPlayer *pKiller,int WeaponID)

{
  CFlag *this_00;
  bool bVar1;
  CCharacter *pCVar2;
  CCharacter *pCVar3;
  long lVar4;
  uint uVar5;
  bool bVar6;
  
  IGameController::OnCharacterDeath(&this->super_IGameController,pVictim,pKiller,WeaponID);
  lVar4 = 0;
  uVar5 = 0;
  bVar6 = true;
  do {
    this_00 = this->m_apFlags[lVar4];
    if ((pKiller == (CPlayer *)0x0) || (this_00 == (CFlag *)0x0)) {
      if (this_00 != (CFlag *)0x0) goto LAB_00120e86;
    }
    else {
      pCVar2 = CPlayer::GetCharacter(pKiller);
      if (pCVar2 != (CCharacter *)0x0) {
        pCVar2 = this_00->m_pCarrier;
        pCVar3 = CPlayer::GetCharacter(pKiller);
        if (pCVar2 == pCVar3) {
          uVar5 = uVar5 | 2;
        }
      }
LAB_00120e86:
      if (this_00->m_pCarrier == pVictim) {
        CGameContext::SendGameMsg((this->super_IGameController).m_pGameServer,4,-1);
        CFlag::Drop(this_00);
        if ((pKiller != (CPlayer *)0x0) && (pKiller->m_Team != pVictim->m_pPlayer->m_Team)) {
          pKiller->m_Score = pKiller->m_Score + 1;
        }
        uVar5 = uVar5 | 1;
      }
    }
    lVar4 = 1;
    bVar1 = !bVar6;
    bVar6 = false;
    if (bVar1) {
      return uVar5;
    }
  } while( true );
}

Assistant:

int CGameControllerCTF::OnCharacterDeath(CCharacter *pVictim, CPlayer *pKiller, int WeaponID)
{
	IGameController::OnCharacterDeath(pVictim, pKiller, WeaponID);
	int HadFlag = 0;

	// drop flags
	for(int i = 0; i < 2; i++)
	{
		CFlag *F = m_apFlags[i];
		if(F && pKiller && pKiller->GetCharacter() && F->GetCarrier() == pKiller->GetCharacter())
			HadFlag |= 2;
		if(F && F->GetCarrier() == pVictim)
		{
			GameServer()->SendGameMsg(GAMEMSG_CTF_DROP, -1);
			F->Drop();

			if(pKiller && pKiller->GetTeam() != pVictim->GetPlayer()->GetTeam())
				pKiller->m_Score++;

			HadFlag |= 1;
		}
	}

	return HadFlag;
}